

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

void embree::avx::OrientedDiscMiIntersector1<8,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  Geometry *pGVar9;
  long lVar10;
  __int_type_conflict _Var11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [32];
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  Scene *pSVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar38 [32];
  float fVar39;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  int local_274;
  Scene *local_270;
  RayQueryContext *local_268;
  RTCFilterFunctionNArguments local_260;
  float local_230;
  undefined4 local_22c;
  undefined4 local_228;
  undefined4 local_224;
  undefined4 local_220;
  uint local_21c;
  uint local_218;
  uint local_214;
  uint local_210;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar37 [64];
  
  local_268 = context;
  pSVar19 = context->scene;
  uVar16 = (ulong)(Disc->primIDs).field_0.i[0];
  local_270 = pSVar19;
  pGVar9 = (pSVar19->geometries).items[Disc->sharedGeomID].ptr;
  lVar10 = *(long *)&pGVar9->field_0x58;
  _Var11 = pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  uVar21 = (ulong)(Disc->primIDs).field_0.i[1];
  uVar20 = (ulong)(Disc->primIDs).field_0.i[4];
  uVar22 = (ulong)(Disc->primIDs).field_0.i[5];
  auVar25._16_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar20);
  auVar25._0_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar16);
  auVar27._16_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar22);
  auVar27._0_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar21);
  uVar23 = (ulong)(Disc->primIDs).field_0.i[2];
  uVar24 = (ulong)(Disc->primIDs).field_0.i[3];
  uVar18 = (ulong)(Disc->primIDs).field_0.i[6];
  auVar28._16_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar18);
  auVar28._0_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar23);
  uVar17 = (ulong)(Disc->primIDs).field_0.i[7];
  auVar29._16_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar17);
  auVar29._0_16_ = *(undefined1 (*) [16])(lVar10 + _Var11 * uVar24);
  lVar10 = *(long *)&pGVar9[1].time_range.upper;
  p_Var12 = pGVar9[1].intersectionFilterN;
  auVar40._16_16_ = *(undefined1 (*) [16])(lVar10 + uVar20 * (long)p_Var12);
  auVar40._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar16 * (long)p_Var12);
  auVar48._16_16_ = *(undefined1 (*) [16])(lVar10 + uVar22 * (long)p_Var12);
  auVar48._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar21 * (long)p_Var12);
  auVar49._16_16_ = *(undefined1 (*) [16])(lVar10 + uVar18 * (long)p_Var12);
  auVar49._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar23 * (long)p_Var12);
  auVar8 = *(undefined1 (*) [16])(lVar10 + (long)p_Var12 * uVar17);
  auVar50._16_16_ = auVar8;
  auVar50._0_16_ = *(undefined1 (*) [16])(lVar10 + uVar24 * (long)p_Var12);
  auVar31 = vunpcklps_avx(auVar25,auVar28);
  local_a0 = vunpckhps_avx(auVar25,auVar28);
  auVar25 = vunpcklps_avx(auVar27,auVar29);
  auVar13 = vunpckhps_avx(auVar27,auVar29);
  auVar34 = vunpcklps_avx(auVar31,auVar25);
  local_1e0 = vunpckhps_avx(auVar31,auVar25);
  local_80 = vunpcklps_avx(local_a0,auVar13);
  auVar27 = vunpcklps_avx(auVar40,auVar49);
  auVar31 = vunpckhps_avx(auVar40,auVar49);
  auVar28 = vunpcklps_avx(auVar48,auVar50);
  auVar25 = vunpckhps_avx(auVar48,auVar50);
  local_c0 = vunpcklps_avx(auVar31,auVar25);
  local_120 = vunpcklps_avx(auVar27,auVar28);
  local_100 = vunpckhps_avx(auVar27,auVar28);
  local_190 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  local_1a0 = local_190;
  fVar1 = (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar51._0_4_ = local_120._0_4_ * fVar1 + fVar2 * local_100._0_4_ + fVar3 * local_c0._0_4_;
  auVar51._4_4_ = local_120._4_4_ * fVar1 + fVar2 * local_100._4_4_ + fVar3 * local_c0._4_4_;
  auVar51._8_4_ = local_120._8_4_ * fVar1 + fVar2 * local_100._8_4_ + fVar3 * local_c0._8_4_;
  auVar51._12_4_ = local_120._12_4_ * fVar1 + fVar2 * local_100._12_4_ + fVar3 * local_c0._12_4_;
  auVar51._16_4_ = local_120._16_4_ * fVar1 + fVar2 * local_100._16_4_ + fVar3 * local_c0._16_4_;
  auVar51._20_4_ = local_120._20_4_ * fVar1 + fVar2 * local_100._20_4_ + fVar3 * local_c0._20_4_;
  auVar51._24_4_ = local_120._24_4_ * fVar1 + fVar2 * local_100._24_4_ + fVar3 * local_c0._24_4_;
  auVar51._28_4_ = auVar8._12_4_ + 0.0 + 0.0;
  auVar25 = vcmpps_avx(auVar51,ZEXT432(0) << 0x20,0);
  auVar8 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar54._16_16_ = auVar8;
  auVar54._0_16_ = auVar8;
  auVar31 = vcvtdq2ps_avx(auVar54);
  auVar27 = vcmpps_avx(_DAT_02020f40,auVar31,1);
  auVar55._8_4_ = 0x3f800000;
  auVar55._0_8_ = &DAT_3f8000003f800000;
  auVar55._12_4_ = 0x3f800000;
  auVar55._16_4_ = 0x3f800000;
  auVar55._20_4_ = 0x3f800000;
  auVar55._24_4_ = 0x3f800000;
  auVar55._28_4_ = 0x3f800000;
  auVar31 = vblendvps_avx(auVar51,auVar55,auVar25);
  fVar4 = (ray->super_RayK<1>).org.field_0.m128[1];
  auVar52._4_4_ = fVar4;
  auVar52._0_4_ = fVar4;
  auVar52._8_4_ = fVar4;
  auVar52._12_4_ = fVar4;
  auVar52._16_4_ = fVar4;
  auVar52._20_4_ = fVar4;
  auVar52._24_4_ = fVar4;
  auVar52._28_4_ = fVar4;
  auVar25 = vandnps_avx(auVar25,auVar27);
  fVar5 = (ray->super_RayK<1>).org.field_0.m128[2];
  auVar53._4_4_ = fVar5;
  auVar53._0_4_ = fVar5;
  auVar53._8_4_ = fVar5;
  auVar53._12_4_ = fVar5;
  auVar53._16_4_ = fVar5;
  auVar53._20_4_ = fVar5;
  auVar53._24_4_ = fVar5;
  auVar53._28_4_ = fVar5;
  auVar27 = vsubps_avx(local_80,auVar53);
  auVar40 = local_c0;
  auVar28 = vsubps_avx(local_1e0,auVar52);
  fVar6 = (ray->super_RayK<1>).org.field_0.m128[0];
  auVar56._4_4_ = fVar6;
  auVar56._0_4_ = fVar6;
  auVar56._8_4_ = fVar6;
  auVar56._12_4_ = fVar6;
  auVar56._16_4_ = fVar6;
  auVar56._20_4_ = fVar6;
  auVar56._24_4_ = fVar6;
  auVar56._28_4_ = fVar6;
  auVar29 = vsubps_avx(auVar34,auVar56);
  auVar30._0_4_ =
       local_120._0_4_ * auVar29._0_4_ +
       auVar27._0_4_ * local_c0._0_4_ + local_100._0_4_ * auVar28._0_4_;
  auVar30._4_4_ =
       local_120._4_4_ * auVar29._4_4_ +
       auVar27._4_4_ * local_c0._4_4_ + local_100._4_4_ * auVar28._4_4_;
  auVar30._8_4_ =
       local_120._8_4_ * auVar29._8_4_ +
       auVar27._8_4_ * local_c0._8_4_ + local_100._8_4_ * auVar28._8_4_;
  auVar30._12_4_ =
       local_120._12_4_ * auVar29._12_4_ +
       auVar27._12_4_ * local_c0._12_4_ + local_100._12_4_ * auVar28._12_4_;
  auVar30._16_4_ =
       local_120._16_4_ * auVar29._16_4_ +
       auVar27._16_4_ * local_c0._16_4_ + local_100._16_4_ * auVar28._16_4_;
  auVar30._20_4_ =
       local_120._20_4_ * auVar29._20_4_ +
       auVar27._20_4_ * local_c0._20_4_ + local_100._20_4_ * auVar28._20_4_;
  auVar30._24_4_ =
       local_120._24_4_ * auVar29._24_4_ +
       auVar27._24_4_ * local_c0._24_4_ + local_100._24_4_ * auVar28._24_4_;
  auVar30._28_4_ = auVar29._28_4_ + auVar27._28_4_ + auVar28._28_4_;
  local_140 = vdivps_avx(auVar30,auVar31);
  auVar41 = ZEXT3264(local_140);
  uVar7 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar31._4_4_ = uVar7;
  auVar31._0_4_ = uVar7;
  auVar31._8_4_ = uVar7;
  auVar31._12_4_ = uVar7;
  auVar31._16_4_ = uVar7;
  auVar31._20_4_ = uVar7;
  auVar31._24_4_ = uVar7;
  auVar31._28_4_ = uVar7;
  fVar39 = (ray->super_RayK<1>).tfar;
  auVar32._4_4_ = fVar39;
  auVar32._0_4_ = fVar39;
  auVar32._8_4_ = fVar39;
  auVar32._12_4_ = fVar39;
  auVar32._16_4_ = fVar39;
  auVar32._20_4_ = fVar39;
  auVar32._24_4_ = fVar39;
  auVar32._28_4_ = fVar39;
  auVar31 = vcmpps_avx(auVar31,local_140,2);
  auVar27 = vcmpps_avx(local_140,auVar32,2);
  auVar31 = vandps_avx(auVar31,auVar27);
  auVar28 = auVar25 & auVar31;
  if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar28 >> 0x7f,0) != '\0') ||
        (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar28 >> 0xbf,0) != '\0') ||
      (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar28[0x1f] < '\0') {
    auVar31 = vandps_avx(auVar31,auVar25);
    auVar29 = vunpckhps_avx(local_a0,auVar13);
    fVar39 = local_140._0_4_;
    fVar42 = local_140._4_4_;
    fVar43 = local_140._8_4_;
    fVar44 = local_140._12_4_;
    fVar45 = local_140._16_4_;
    fVar46 = local_140._20_4_;
    fVar47 = local_140._24_4_;
    auVar33._0_4_ = fVar6 + fVar39 * fVar1;
    auVar33._4_4_ = fVar6 + fVar42 * fVar1;
    auVar33._8_4_ = fVar6 + fVar43 * fVar1;
    auVar33._12_4_ = fVar6 + fVar44 * fVar1;
    auVar33._16_4_ = fVar6 + fVar45 * fVar1;
    auVar33._20_4_ = fVar6 + fVar46 * fVar1;
    auVar33._24_4_ = fVar6 + fVar47 * fVar1;
    auVar33._28_4_ = fVar6 + auVar27._28_4_;
    auVar35._0_4_ = fVar4 + fVar2 * fVar39;
    auVar35._4_4_ = fVar4 + fVar2 * fVar42;
    auVar35._8_4_ = fVar4 + fVar2 * fVar43;
    auVar35._12_4_ = fVar4 + fVar2 * fVar44;
    auVar35._16_4_ = fVar4 + fVar2 * fVar45;
    auVar35._20_4_ = fVar4 + fVar2 * fVar46;
    auVar35._24_4_ = fVar4 + fVar2 * fVar47;
    auVar35._28_4_ = fVar4 + auVar34._28_4_;
    auVar38._0_4_ = fVar5 + fVar3 * fVar39;
    auVar38._4_4_ = fVar5 + fVar3 * fVar42;
    auVar38._8_4_ = fVar5 + fVar3 * fVar43;
    auVar38._12_4_ = fVar5 + fVar3 * fVar44;
    auVar38._16_4_ = fVar5 + fVar3 * fVar45;
    auVar38._20_4_ = fVar5 + fVar3 * fVar46;
    auVar38._24_4_ = fVar5 + fVar3 * fVar47;
    auVar38._28_4_ = fVar5 + auVar13._28_4_;
    auVar25 = vsubps_avx(auVar33,auVar34);
    auVar27 = vsubps_avx(auVar35,local_1e0);
    auVar28 = vsubps_avx(auVar38,local_80);
    auVar34._0_4_ =
         auVar25._0_4_ * auVar25._0_4_ +
         auVar27._0_4_ * auVar27._0_4_ + auVar28._0_4_ * auVar28._0_4_;
    auVar34._4_4_ =
         auVar25._4_4_ * auVar25._4_4_ +
         auVar27._4_4_ * auVar27._4_4_ + auVar28._4_4_ * auVar28._4_4_;
    auVar34._8_4_ =
         auVar25._8_4_ * auVar25._8_4_ +
         auVar27._8_4_ * auVar27._8_4_ + auVar28._8_4_ * auVar28._8_4_;
    auVar34._12_4_ =
         auVar25._12_4_ * auVar25._12_4_ +
         auVar27._12_4_ * auVar27._12_4_ + auVar28._12_4_ * auVar28._12_4_;
    auVar34._16_4_ =
         auVar25._16_4_ * auVar25._16_4_ +
         auVar27._16_4_ * auVar27._16_4_ + auVar28._16_4_ * auVar28._16_4_;
    auVar34._20_4_ =
         auVar25._20_4_ * auVar25._20_4_ +
         auVar27._20_4_ * auVar27._20_4_ + auVar28._20_4_ * auVar28._20_4_;
    auVar34._24_4_ =
         auVar25._24_4_ * auVar25._24_4_ +
         auVar27._24_4_ * auVar27._24_4_ + auVar28._24_4_ * auVar28._24_4_;
    auVar34._28_4_ = auVar25._28_4_ + auVar27._28_4_ + auVar28._28_4_;
    auVar13._4_4_ = auVar29._4_4_ * auVar29._4_4_;
    auVar13._0_4_ = auVar29._0_4_ * auVar29._0_4_;
    auVar13._8_4_ = auVar29._8_4_ * auVar29._8_4_;
    auVar13._12_4_ = auVar29._12_4_ * auVar29._12_4_;
    auVar13._16_4_ = auVar29._16_4_ * auVar29._16_4_;
    auVar13._20_4_ = auVar29._20_4_ * auVar29._20_4_;
    auVar13._24_4_ = auVar29._24_4_ * auVar29._24_4_;
    auVar13._28_4_ = auVar29._28_4_;
    auVar25 = vcmpps_avx(auVar34,auVar13,1);
    auVar27 = auVar31 & auVar25;
    if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar27 >> 0x7f,0) != '\0') ||
          (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar27 >> 0xbf,0) != '\0') ||
        (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar27[0x1f] < '\0')
    {
      auVar31 = vandps_avx(auVar31,auVar25);
      local_160 = ZEXT432(0) << 0x20;
      local_180 = ZEXT432(0) << 0x20;
      local_e0 = local_c0._0_8_;
      uStack_d8 = local_c0._8_8_;
      uStack_d0 = local_c0._16_8_;
      uStack_c8 = local_c0._24_8_;
      local_200 = auVar31;
      auVar36._8_4_ = 0x7f800000;
      auVar36._0_8_ = 0x7f8000007f800000;
      auVar36._12_4_ = 0x7f800000;
      auVar36._16_4_ = 0x7f800000;
      auVar36._20_4_ = 0x7f800000;
      auVar36._24_4_ = 0x7f800000;
      auVar36._28_4_ = 0x7f800000;
      auVar37 = ZEXT3264(auVar36);
      auVar25 = vblendvps_avx(auVar36,local_140,auVar31);
      auVar27 = vshufps_avx(auVar25,auVar25,0xb1);
      auVar27 = vminps_avx(auVar25,auVar27);
      auVar28 = vshufpd_avx(auVar27,auVar27,5);
      auVar27 = vminps_avx(auVar27,auVar28);
      auVar28 = vperm2f128_avx(auVar27,auVar27,1);
      auVar27 = vminps_avx(auVar27,auVar28);
      auVar25 = vcmpps_avx(auVar25,auVar27,0);
      auVar27 = auVar31 & auVar25;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar27 >> 0x7f,0) != '\0') ||
            (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar27 >> 0xbf,0) != '\0') ||
          (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar27[0x1f] < '\0') {
        auVar31 = vandps_avx(auVar25,auVar31);
      }
      uVar14 = vmovmskps_avx(auVar31);
      uVar15 = 0;
      local_c0 = auVar40;
      if (uVar14 != 0) {
        for (; (uVar14 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
        }
      }
      do {
        uVar16 = (ulong)uVar15;
        local_218 = *(uint *)(local_1a0 + uVar16 * 4);
        pGVar9 = (pSVar19->geometries).items[local_218].ptr;
        if ((pGVar9->mask & (ray->super_RayK<1>).mask) == 0) {
          *(undefined4 *)(local_200 + uVar16 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            fVar1 = *(float *)(local_180 + uVar16 * 4);
            fVar2 = *(float *)(local_160 + uVar16 * 4);
            (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar16 * 4);
            (ray->Ng).field_0.field_0.x = *(float *)(local_120 + uVar16 * 4);
            (ray->Ng).field_0.field_0.y = *(float *)(local_100 + uVar16 * 4);
            (ray->Ng).field_0.field_0.z = *(float *)((long)&local_e0 + uVar16 * 4);
            ray->u = fVar1;
            ray->v = fVar2;
            ray->primID = (Disc->primIDs).field_0.i[uVar16];
            ray->geomID = local_218;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
            return;
          }
          local_230 = *(float *)(local_120 + uVar16 * 4);
          local_22c = *(undefined4 *)(local_100 + uVar16 * 4);
          local_228 = *(undefined4 *)((long)&local_e0 + uVar16 * 4);
          local_224 = *(undefined4 *)(local_180 + uVar16 * 4);
          local_220 = *(undefined4 *)(local_160 + uVar16 * 4);
          local_21c = (Disc->primIDs).field_0.i[uVar16];
          local_214 = context->user->instID[0];
          local_210 = context->user->instPrimID[0];
          local_1e0._0_4_ = (ray->super_RayK<1>).tfar;
          (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar16 * 4);
          local_274 = -1;
          local_260.valid = &local_274;
          local_260.geometryUserPtr = pGVar9->userPtr;
          local_260.context = context->user;
          local_260.ray = (RTCRayN *)ray;
          local_260.hit = (RTCHitN *)&local_230;
          local_260.N = 1;
          local_1c0 = auVar41._0_32_;
          if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0109f07e:
            p_Var12 = context->args->filter;
            if (p_Var12 != (RTCFilterFunctionN)0x0) {
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var12)(&local_260);
                auVar37 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar41 = ZEXT3264(local_1c0);
                pSVar19 = local_270;
              }
              if (*local_260.valid == 0) goto LAB_0109f187;
            }
            (((Vec3f *)((long)local_260.ray + 0x30))->field_0).field_0.x = *(float *)local_260.hit;
            (((Vec3f *)((long)local_260.ray + 0x30))->field_0).field_0.y =
                 *(float *)(local_260.hit + 4);
            (((Vec3f *)((long)local_260.ray + 0x30))->field_0).field_0.z =
                 *(float *)(local_260.hit + 8);
            *(float *)((long)local_260.ray + 0x3c) = *(float *)(local_260.hit + 0xc);
            *(float *)((long)local_260.ray + 0x40) = *(float *)(local_260.hit + 0x10);
            *(float *)((long)local_260.ray + 0x44) = *(float *)(local_260.hit + 0x14);
            *(float *)((long)local_260.ray + 0x48) = *(float *)(local_260.hit + 0x18);
            *(float *)((long)local_260.ray + 0x4c) = *(float *)(local_260.hit + 0x1c);
            *(float *)((long)local_260.ray + 0x50) = *(float *)(local_260.hit + 0x20);
          }
          else {
            (*pGVar9->intersectionFilterN)(&local_260);
            auVar37 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar41 = ZEXT3264(local_1c0);
            pSVar19 = local_270;
            if (*local_260.valid != 0) goto LAB_0109f07e;
LAB_0109f187:
            (ray->super_RayK<1>).tfar = (float)local_1e0._0_4_;
          }
          *(undefined4 *)(local_200 + uVar16 * 4) = 0;
          fVar1 = (ray->super_RayK<1>).tfar;
          auVar26._4_4_ = fVar1;
          auVar26._0_4_ = fVar1;
          auVar26._8_4_ = fVar1;
          auVar26._12_4_ = fVar1;
          auVar26._16_4_ = fVar1;
          auVar26._20_4_ = fVar1;
          auVar26._24_4_ = fVar1;
          auVar26._28_4_ = fVar1;
          auVar31 = vcmpps_avx(auVar41._0_32_,auVar26,2);
          local_200 = vandps_avx(auVar31,local_200);
        }
        if ((((((((local_200 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_200 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_200 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_200 >> 0x7f,0) == '\0') &&
              (local_200 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_200 >> 0xbf,0) == '\0') &&
            (local_200 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_200[0x1f]) {
          return;
        }
        auVar31 = vblendvps_avx(auVar37._0_32_,auVar41._0_32_,local_200);
        auVar25 = vshufps_avx(auVar31,auVar31,0xb1);
        auVar25 = vminps_avx(auVar31,auVar25);
        auVar27 = vshufpd_avx(auVar25,auVar25,5);
        auVar25 = vminps_avx(auVar25,auVar27);
        auVar27 = vperm2f128_avx(auVar25,auVar25,1);
        auVar25 = vminps_avx(auVar25,auVar27);
        auVar25 = vcmpps_avx(auVar31,auVar25,0);
        auVar27 = local_200 & auVar25;
        auVar31 = local_200;
        if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar27 >> 0x7f,0) != '\0') ||
              (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar27 >> 0xbf,0) != '\0') ||
            (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar27[0x1f] < '\0') {
          auVar31 = vandps_avx(auVar25,local_200);
        }
        uVar14 = vmovmskps_avx(auVar31);
        uVar15 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, n0, Intersect1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }